

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_zip.cpp
# Opt level: O0

int AppendToZip(FILE *zip_file,char *filename,FCompressedBuffer *content,uint16_t date,uint16_t time
               )

{
  size_t sVar1;
  long lVar2;
  undefined2 local_54;
  undefined1 auStack_4a [2];
  int position;
  undefined2 local_44;
  FZipLocalFileHeader local;
  uint16_t time_local;
  uint16_t date_local;
  FCompressedBuffer *content_local;
  char *filename_local;
  FILE *zip_file_local;
  
  _auStack_4a = 0x4034b50;
  position._2_1_ = 0x14;
  position._3_1_ = 0;
  if (content->mMethod == 8) {
    local_54 = 2;
  }
  else {
    local_54 = (undefined2)content->mZipFlags;
  }
  local_44 = local_54;
  local.Magic._0_2_ = (undefined2)content->mMethod;
  local._6_4_ = content->mCRC32;
  local.CRC32 = content->mSize;
  local._10_4_ = content->mCompressedSize;
  local.Magic._2_2_ = time;
  local.VersionToExtract = (BYTE  [2])date;
  local.UncompressedSize._0_2_ = time;
  local.UncompressedSize._2_2_ = date;
  unique0x100000ec = content;
  sVar1 = strlen(filename);
  local.CompressedSize._0_2_ = (undefined2)sVar1;
  local.CompressedSize._2_2_ = 0;
  lVar2 = ftell((FILE *)zip_file);
  sVar1 = fwrite(auStack_4a,0x1e,1,(FILE *)zip_file);
  if (sVar1 == 1) {
    sVar1 = strlen(filename);
    sVar1 = fwrite(filename,sVar1,1,(FILE *)zip_file);
    if ((sVar1 == 1) &&
       (sVar1 = fwrite(stack0xffffffffffffffd8->mBuffer,1,
                       (ulong)stack0xffffffffffffffd8->mCompressedSize,(FILE *)zip_file),
       sVar1 == stack0xffffffffffffffd8->mCompressedSize)) {
      return (int)lVar2;
    }
  }
  return -1;
}

Assistant:

int AppendToZip(FILE *zip_file, const char *filename, FCompressedBuffer &content, uint16_t date, uint16_t time)
{
	FZipLocalFileHeader local;
	int position;

	local.Magic = ZIP_LOCALFILE;
	local.VersionToExtract[0] = 20;
	local.VersionToExtract[1] = 0;
	local.Flags = content.mMethod == METHOD_DEFLATE ? LittleShort(2) : LittleShort((uint16_t)content.mZipFlags);
	local.Method = LittleShort(content.mMethod);
	local.ModDate = date;
	local.ModTime = time;
	local.CRC32 = content.mCRC32;
	local.UncompressedSize = LittleLong(content.mSize);
	local.CompressedSize = LittleLong(content.mCompressedSize);
	local.NameLength = LittleShort((unsigned short)strlen(filename));
	local.ExtraLength = 0;

	// Fill in local directory header.

	position = (int)ftell(zip_file);

	// Write out the header, file name, and file data.
	if (fwrite(&local, sizeof(local), 1, zip_file) != 1 ||
		fwrite(filename, strlen(filename), 1, zip_file) != 1 ||
		fwrite(content.mBuffer, 1, content.mCompressedSize, zip_file) != content.mCompressedSize)
	{
		return -1;
	}
	return position;
}